

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall
ON_SurfaceCurvatureColorMapping::Hash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SurfaceCurvatureColorMapping *this)

{
  undefined8 uVar1;
  bool bVar2;
  ON_UUID uniqueness_boost;
  ON_UUID local_a8;
  ON_SHA1 local_98;
  
  bVar2 = IsSet(this);
  if (bVar2) {
    local_98.m_state[2] = 0;
    local_98.m_state[3] = 0;
    local_98.m_state[4] = 0;
    local_98.m_bit_count[0] = 0;
    local_98.m_bit_count[1] = 0;
    local_98.m_state[0] = 0;
    local_98.m_state[1] = 0;
    local_98.m_buffer[0x30] = '\0';
    local_98.m_buffer[0x31] = '\0';
    local_98.m_buffer[0x32] = '\0';
    local_98.m_buffer[0x33] = '\0';
    local_98.m_buffer[0x34] = '\0';
    local_98.m_buffer[0x35] = '\0';
    local_98.m_buffer[0x36] = '\0';
    local_98.m_buffer[0x37] = '\0';
    local_98.m_buffer[0x38] = '\0';
    local_98.m_buffer[0x39] = '\0';
    local_98.m_buffer[0x3a] = '\0';
    local_98.m_buffer[0x3b] = '\0';
    local_98.m_buffer[0x3c] = '\0';
    local_98.m_buffer[0x3d] = '\0';
    local_98.m_buffer[0x3e] = '\0';
    local_98.m_buffer[0x3f] = '\0';
    local_98.m_buffer[0x20] = '\0';
    local_98.m_buffer[0x21] = '\0';
    local_98.m_buffer[0x22] = '\0';
    local_98.m_buffer[0x23] = '\0';
    local_98.m_buffer[0x24] = '\0';
    local_98.m_buffer[0x25] = '\0';
    local_98.m_buffer[0x26] = '\0';
    local_98.m_buffer[0x27] = '\0';
    local_98.m_buffer[0x28] = '\0';
    local_98.m_buffer[0x29] = '\0';
    local_98.m_buffer[0x2a] = '\0';
    local_98.m_buffer[0x2b] = '\0';
    local_98.m_buffer[0x2c] = '\0';
    local_98.m_buffer[0x2d] = '\0';
    local_98.m_buffer[0x2e] = '\0';
    local_98.m_buffer[0x2f] = '\0';
    local_98.m_buffer[0x10] = '\0';
    local_98.m_buffer[0x11] = '\0';
    local_98.m_buffer[0x12] = '\0';
    local_98.m_buffer[0x13] = '\0';
    local_98.m_buffer[0x14] = '\0';
    local_98.m_buffer[0x15] = '\0';
    local_98.m_buffer[0x16] = '\0';
    local_98.m_buffer[0x17] = '\0';
    local_98.m_buffer[0x18] = '\0';
    local_98.m_buffer[0x19] = '\0';
    local_98.m_buffer[0x1a] = '\0';
    local_98.m_buffer[0x1b] = '\0';
    local_98.m_buffer[0x1c] = '\0';
    local_98.m_buffer[0x1d] = '\0';
    local_98.m_buffer[0x1e] = '\0';
    local_98.m_buffer[0x1f] = '\0';
    local_98.m_buffer[0] = '\0';
    local_98.m_buffer[1] = '\0';
    local_98.m_buffer[2] = '\0';
    local_98.m_buffer[3] = '\0';
    local_98.m_buffer[4] = '\0';
    local_98.m_buffer[5] = '\0';
    local_98.m_buffer[6] = '\0';
    local_98.m_buffer[7] = '\0';
    local_98.m_buffer[8] = '\0';
    local_98.m_buffer[9] = '\0';
    local_98.m_buffer[10] = '\0';
    local_98.m_buffer[0xb] = '\0';
    local_98.m_buffer[0xc] = '\0';
    local_98.m_buffer[0xd] = '\0';
    local_98.m_buffer[0xe] = '\0';
    local_98.m_buffer[0xf] = '\0';
    local_98.m_byte_count = 0;
    local_98.m_status_bits = 0;
    local_98.m_reserved = 0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_98.m_sha1_hash);
    local_a8.Data1 = 0x639e9144;
    local_a8.Data2 = 0x1c1a;
    local_a8.Data3 = 0x4bba;
    local_a8.Data4[0] = 0x82;
    local_a8.Data4[1] = 'H';
    local_a8.Data4[2] = 0xd3;
    local_a8.Data4[3] = '0';
    local_a8.Data4[4] = 0xf5;
    local_a8.Data4[5] = '\r';
    local_a8.Data4[6] = '{';
    local_a8.Data4[7] = 'i';
    ON_SHA1::AccumulateId(&local_98,&local_a8);
    ON_SHA1::AccumulateInteger32(&local_98,this->m_kappa_style);
    ON_SHA1::AccumulateDoubleArray(&local_98,2,(this->m_kappa_range).m_t);
    ON_SHA1::AccumulateDoubleArray(&local_98,2,(this->m_hue_range_in_radians).m_t);
    ON_SHA1::Hash(__return_storage_ptr__,&local_98);
  }
  else {
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)__return_storage_ptr__->m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SurfaceCurvatureColorMapping::Hash() const
{
  if (this->IsSet())
  {
    ON_SHA1 sha1;

    // The uuid is accumulated because an int,double,double could easily
    // be the intput data int many unrelated contexts. This sha1 is used
    // to avoid expensive recalculations of curvatures and their false colors.
    const ON_UUID uniqueness_boost = ON_SurfaceCurvatureColorMapping::Id;
    sha1.AccumulateId(uniqueness_boost);

    const unsigned u = (unsigned)this->m_kappa_style;
    sha1.AccumulateInteger32(u);

    sha1.AccumulateDoubleArray(2, this->m_kappa_range.m_t);

    sha1.AccumulateDoubleArray(2, this->m_hue_range_in_radians.m_t);

    return sha1.Hash();
  }
  return ON_SHA1_Hash::EmptyContentHash;
}